

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

Expression * wasm::I64Utilities::getI64High(Builder *builder,Index index)

{
  Expression *pEVar1;
  Const *pCVar2;
  Binary *this;
  Unary *this_00;
  
  pEVar1 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar1->_id = LocalGetId;
  *(Index *)(pEVar1 + 1) = index;
  (pEVar1->type).id = 3;
  pCVar2 = Builder::makeConst<long>(builder,0x20);
  this = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this->op = ShrUInt64;
  this->left = pEVar1;
  this->right = (Expression *)pCVar2;
  Binary::finalize(this);
  this_00 = (Unary *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_00->op = WrapInt64;
  this_00->value = (Expression *)this;
  Unary::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

static Expression* getI64High(Builder& builder, Index index) {
    return builder.makeUnary(
      WrapInt64,
      builder.makeBinary(ShrUInt64,
                         builder.makeLocalGet(index, Type::i64),
                         builder.makeConst(int64_t(32))));
  }